

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

void __thiscall Minisat::Solver::MyQueue<int>::push(MyQueue<int> *this,int e)

{
  int index;
  int *piVar1;
  int in_ESI;
  int *in_RDI;
  
  if (in_RDI[1] < *in_RDI) {
    in_RDI[1] = in_RDI[1] + 1;
  }
  else {
    piVar1 = vec<int>::operator[]((vec<int> *)(in_RDI + 6),in_RDI[2]);
    *(long *)(in_RDI + 4) = *(long *)(in_RDI + 4) - (long)*piVar1;
  }
  *(long *)(in_RDI + 4) = (long)in_ESI + *(long *)(in_RDI + 4);
  index = in_RDI[2];
  in_RDI[2] = index + 1;
  piVar1 = vec<int>::operator[]((vec<int> *)(in_RDI + 6),index);
  *piVar1 = in_ESI;
  if (in_RDI[2] == *in_RDI) {
    in_RDI[2] = 0;
  }
  return;
}

Assistant:

void push(T e)
        {
            if (q_sz < max_sz)
                q_sz++;
            else
                sum -= q[ptr];
            sum += e;
            q[ptr++] = e;
            if (ptr == max_sz) ptr = 0;
        }